

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

bool __thiscall ExchCXX::detail::LibxcKernelImpl::is_epc_(LibxcKernelImpl *this)

{
  int xcNumber;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  xc_info((LibxcKernelImpl *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return false;
}

Assistant:

bool LibxcKernelImpl::is_epc_() const noexcept {
  int xcNumber = xc_info()->number;
  return
#if XC_MAJOR_VERSION > 7
  xcNumber == XC_LDA_C_EPC17 or xcNumber == XC_LDA_C_EPC17_2 or xcNumber == XC_LDA_C_EPC18_1 or xcNumber == XC_LDA_C_EPC18_2;
#else
  false;
#endif
}